

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O0

void __thiscall
TasGrid::GridSequence::evalHierarchicalFunctions(GridSequence *this,double *x,double *fvalues)

{
  bool bVar1;
  int *piVar2;
  reference pvVar3;
  reference pvVar4;
  MultiIndexSet *local_78;
  int local_68;
  int j;
  int *p;
  undefined1 local_48 [4];
  int i;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  cache;
  int num_points;
  MultiIndexSet *work;
  double *fvalues_local;
  double *x_local;
  GridSequence *this_local;
  
  bVar1 = MultiIndexSet::empty(&(this->super_BaseCanonicalGrid).points);
  if (bVar1) {
    local_78 = &(this->super_BaseCanonicalGrid).needed;
  }
  else {
    local_78 = &(this->super_BaseCanonicalGrid).points;
  }
  cache.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = MultiIndexSet::getNumIndexes(local_78);
  cacheBasisValues<double>
            ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)local_48,this,x);
  for (p._4_4_ = 0;
      p._4_4_ < cache.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; p._4_4_ = p._4_4_ + 1) {
    piVar2 = MultiIndexSet::getIndex(local_78,p._4_4_);
    pvVar3 = ::std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)local_48,0);
    pvVar4 = ::std::vector<double,_std::allocator<double>_>::operator[](pvVar3,(long)*piVar2);
    fvalues[p._4_4_] = *pvVar4;
    for (local_68 = 1; local_68 < (this->super_BaseCanonicalGrid).num_dimensions;
        local_68 = local_68 + 1) {
      pvVar3 = ::std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)local_48,(long)local_68);
      pvVar4 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         (pvVar3,(long)piVar2[local_68]);
      fvalues[p._4_4_] = *pvVar4 * fvalues[p._4_4_];
    }
  }
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_48);
  return;
}

Assistant:

void GridSequence::evalHierarchicalFunctions(const double x[], double fvalues[]) const{
    const MultiIndexSet& work = (points.empty()) ? needed : points;
    int num_points = work.getNumIndexes();

    std::vector<std::vector<double>> cache = cacheBasisValues<double>(x);

    for(int i=0; i<num_points; i++){
        const int* p = work.getIndex(i);
        fvalues[i] = cache[0][p[0]];
        for(int j=1; j<num_dimensions; j++){
            fvalues[i] *= cache[j][p[j]];
        }
    }
}